

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O2

void printSysCROperand(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  MCOperand *op;
  int64_t iVar3;
  
  op = MCInst_getOperand(MI,OpNo);
  iVar3 = MCOperand_getImm(op);
  SStream_concat(O,"c%u",iVar3);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
    puVar1[0] = '@';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    iVar3 = MCOperand_getImm(op);
    pcVar2 = MI->flat_insn->detail;
    *(long *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) =
         (long)(int)iVar3;
    puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printSysCROperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNo);
	//assert(Op.isImm() && "System instruction C[nm] operands must be immediates!");
	SStream_concat(O, "c%u", MCOperand_getImm(Op));
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_CIMM;
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (int)MCOperand_getImm(Op);
		MI->flat_insn->detail->arm64.op_count++;
	}
}